

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonValidFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  int iVar1;
  u32 uVar2;
  JsonParse *pParse;
  ulong val;
  ulong uVar3;
  long in_FS_OFFSET;
  JsonParse local_70;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 1;
  if (argc == 2) {
    uVar3 = sqlite3VdbeIntValue(argv[1]);
    if (0xe < uVar3 - 1) {
      ctx->isError = 1;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        sqlite3VdbeMemSetStr
                  (ctx->pOut,"FLAGS parameter to json_valid() must be between 1 and 15",-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
        return;
      }
      goto LAB_001b85c1;
    }
  }
  if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
      [(*argv)->flags & 0x3f] != '\x05') {
    if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
        [(*argv)->flags & 0x3f] == '\x04') {
      iVar1 = jsonFuncArgMightBeBinary(*argv);
      if (iVar1 == 0) goto LAB_001b84df;
      val = 1;
      if ((uVar3 & 4) == 0) {
        if ((uVar3 & 8) != 0) {
          local_70.nIns = 0;
          local_70.iLabel = 0;
          local_70.aIns = (u8 *)0x0;
          local_70.iErr = 0;
          local_70.iDepth = 0;
          local_70.nErr = '\0';
          local_70.oom = '\0';
          local_70.bJsonIsRCStr = '\0';
          local_70.hasNonstd = '\0';
          local_70.bReadOnly = '\0';
          local_70.eEdit = '\0';
          local_70.delta = 0;
          local_70.db = (sqlite3 *)0x0;
          local_70.nJson = 0;
          local_70.nJPRef = 0;
          local_70.nBlob = 0;
          local_70.nBlobAlloc = 0;
          local_70.zJson = (char *)0x0;
          local_70.aBlob = (u8 *)sqlite3_value_blob(*argv);
          uVar2 = sqlite3ValueBytes(*argv,'\x01');
          local_70.nBlob = uVar2;
          uVar2 = jsonbValidityCheck(&local_70,0,uVar2,1);
          val = (ulong)(uVar2 == 0);
          goto LAB_001b8574;
        }
        goto LAB_001b855d;
      }
    }
    else {
LAB_001b84df:
      if ((uVar3 & 3) != 0) {
        pParse = jsonParseFuncArg(ctx,*argv,2);
        if (pParse != (JsonParse *)0x0) {
          if (pParse->oom == '\0') {
            if ((pParse->nErr != '\0') || (((uVar3 & 2) == 0 && (pParse->hasNonstd != '\0'))))
            goto LAB_001b8569;
            val = 1;
          }
          else {
            sqlite3_result_error_nomem(ctx);
LAB_001b8569:
            val = 0;
          }
          jsonParseFree(pParse);
          goto LAB_001b8574;
        }
        sqlite3_result_error_nomem(ctx);
      }
LAB_001b855d:
      val = 0;
    }
LAB_001b8574:
    pMem = ctx->pOut;
    if ((pMem->flags & 0x9000) == 0) {
      (pMem->u).i = val;
      pMem->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMem,val);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001b85c1:
  __stack_chk_fail();
}

Assistant:

static void jsonValidFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  u8 flags = 1;
  u8 res = 0;
  if( argc==2 ){
    i64 f = sqlite3_value_int64(argv[1]);
    if( f<1 || f>15 ){
      sqlite3_result_error(ctx, "FLAGS parameter to json_valid() must be"
                                " between 1 and 15", -1);
      return;
    }
    flags = f & 0x0f;
  }
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_NULL: {
#ifdef SQLITE_LEGACY_JSON_VALID
      /* Incorrect legacy behavior was to return FALSE for a NULL input */
      sqlite3_result_int(ctx, 0);
#endif
      return;
    }
    case SQLITE_BLOB: {
      if( jsonFuncArgMightBeBinary(argv[0]) ){
        if( flags & 0x04 ){
          /* Superficial checking only - accomplished by the
          ** jsonFuncArgMightBeBinary() call above. */
          res = 1;
        }else if( flags & 0x08 ){
          /* Strict checking.  Check by translating BLOB->TEXT->BLOB.  If
          ** no errors occur, call that a "strict check". */
          JsonParse px;
          u32 iErr;
          memset(&px, 0, sizeof(px));
          px.aBlob = (u8*)sqlite3_value_blob(argv[0]);
          px.nBlob = sqlite3_value_bytes(argv[0]);
          iErr = jsonbValidityCheck(&px, 0, px.nBlob, 1);
          res = iErr==0;
        }
        break;
      }
      /* Fall through into interpreting the input as text.  See note
      ** above at tag-20240123-a. */
      /* no break */ deliberate_fall_through
    }
    default: {
      JsonParse px;
      if( (flags & 0x3)==0 ) break;
      memset(&px, 0, sizeof(px));

      p = jsonParseFuncArg(ctx, argv[0], JSON_KEEPERROR);
      if( p ){
        if( p->oom ){
          sqlite3_result_error_nomem(ctx);
        }else if( p->nErr ){
          /* no-op */
        }else if( (flags & 0x02)!=0 || p->hasNonstd==0 ){
          res = 1;
        }
        jsonParseFree(p);
      }else{
        sqlite3_result_error_nomem(ctx);
      }
      break;
    }
  }
  sqlite3_result_int(ctx, res);
}